

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Accuracy::TextureCubeFilteringCase::iterate(TextureCubeFilteringCase *this)

{
  TextureRenderer *renderer;
  TestLog *log;
  pointer ppTVar1;
  RenderContext *context;
  TestContext *this_00;
  int iVar2;
  deUint32 seed;
  float fVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  NotSupportedError *this_01;
  int height;
  int width;
  TextureCube *format;
  int width_00;
  bool bVar4;
  ulong uVar5;
  int height_00;
  Vec2 local_1c0;
  int score;
  float fStack_1b4;
  Vec2 local_1b0;
  RandomViewport viewport;
  undefined1 local_188 [32];
  int local_168;
  anon_union_16_3_1194ccdc_for_v local_164;
  undefined8 local_154;
  Surface referenceFrame;
  Surface renderedFrame;
  undefined1 local_104 [76];
  size_type sStack_b8;
  size_type local_b0;
  int aiStack_a8 [2];
  int local_a0;
  anon_union_16_3_1194ccdc_for_v local_9c;
  bool local_8c;
  undefined7 uStack_8b;
  LodMode local_84;
  TextureFormatInfo fmtInfo;
  Functions *gl;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  seed = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar2),0xa8,0x70,seed);
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_104,TEXTURETYPE_CUBE);
  format = &(*(this->m_textures).
              super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
              super__Vector_impl_data._M_start)->m_refTexture;
  tcu::getTextureFormatInfo(&fmtInfo,&format->m_format);
  if (((this->super_TestCase).super_TestNode.m_nodeType == NODETYPE_ACCURACY) &&
     ((viewport.width < 0xa8 || (viewport.height < 0x70)))) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureFilteringTests.cpp"
               ,0x21e);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  width_00 = viewport.width / 2;
  height_00 = viewport.height / 2;
  glu::mapGLSampler((Sampler *)local_188,this->m_wrapS,this->m_wrapT,this->m_minFilter,
                    this->m_magFilter);
  local_a0 = local_168;
  local_b0 = local_188._16_8_;
  aiStack_a8[0] = local_188._24_4_;
  aiStack_a8[1] = local_188._28_4_;
  local_104._68_8_ = local_188._0_8_;
  sStack_b8 = local_188._8_8_;
  local_9c._0_8_ = local_164._0_8_;
  local_9c._8_8_ = local_164._8_8_;
  uStack_8b = SUB87(local_154,1);
  local_8c = true;
  local_104._4_4_ = glu::TextureTestUtil::getSamplerType(format->m_format);
  local_104._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_104._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_104._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_104._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_104._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_104._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_104._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_104._48_4_ = fmtInfo.lookupScale.m_data[3];
  local_84 = LODMODE_EXACT;
  (*gl->activeTexture)(0x84c0);
  (*gl->bindTexture)(0x8513,(*(this->m_textures).
                              super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_glTexture);
  (*gl->texParameteri)(0x8513,0x2802,this->m_wrapS);
  (*gl->texParameteri)(0x8513,0x2803,this->m_wrapT);
  (*gl->texParameteri)(0x8513,0x2801,this->m_minFilter);
  (*gl->texParameteri)(0x8513,0x2800,this->m_magFilter);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)local_188,&referenceFrame,
             (PixelFormat *)(CONCAT44(extraout_var_01,iVar2) + 8),0,0,width_00,height_00);
  width = viewport.width - width_00;
  height = viewport.height - height_00;
  renderer = &this->m_renderer;
  iVar2 = *(int *)&this->m_onlySampleFaceInterior;
  if ((char)iVar2 == '\0') {
    fStack_1b4 = -0.975;
    local_1c0.m_data[1] = 0.975;
  }
  else {
    fStack_1b4 = -0.81;
    local_1c0.m_data[1] = 0.8;
  }
  score = (int)fStack_1b4;
  uVar5 = CONCAT44((iVar2 << 0x1f) >> 0x1f,(iVar2 << 0x1f) >> 0x1f);
  local_1c0.m_data[0] = local_1c0.m_data[1];
  local_1b0.m_data = (float  [2])(uVar5 & DAT_009a4d00 | ~uVar5 & (ulong)DAT_009a4cf0);
  renderFaces(gl,(SurfaceAccess *)local_188,
              &(*(this->m_textures).
                 super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl
                 .super__Vector_impl_data._M_start)->m_refTexture,(ReferenceParams *)local_104,
              renderer,viewport.x,viewport.y,width_00,height_00,(Vec2 *)&score,&local_1c0,&local_1b0
             );
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)local_188,&referenceFrame,
             (PixelFormat *)(CONCAT44(extraout_var_02,iVar2) + 8),width_00,0,width,height_00);
  score = 0x3f000000;
  fStack_1b4 = 0.65;
  iVar2 = *(int *)&this->m_onlySampleFaceInterior;
  if ((char)iVar2 == '\0') {
    local_1c0.m_data[1] = 0.975;
  }
  else {
    local_1c0.m_data[1] = 0.8;
  }
  local_1c0.m_data[0] = local_1c0.m_data[1];
  uVar5 = CONCAT44((iVar2 << 0x1f) >> 0x1f,(iVar2 << 0x1f) >> 0x1f);
  local_1b0.m_data = (float  [2])(uVar5 & DAT_009a4d00 | ~uVar5 & (ulong)DAT_009a4d20);
  renderFaces(gl,(SurfaceAccess *)local_188,
              &(*(this->m_textures).
                 super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl
                 .super__Vector_impl_data._M_start)->m_refTexture,(ReferenceParams *)local_104,
              renderer,viewport.x + width_00,viewport.y,width,height_00,(Vec2 *)&score,&local_1c0,
              &local_1b0);
  ppTVar1 = (this->m_textures).
            super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar4 = 8 < (ulong)((long)(this->m_textures).
                            super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1);
  if (bVar4) {
    (*gl->bindTexture)(0x8513,ppTVar1[1]->m_glTexture);
    (*gl->texParameteri)(0x8513,0x2802,this->m_wrapS);
    (*gl->texParameteri)(0x8513,0x2803,this->m_wrapT);
    (*gl->texParameteri)(0x8513,0x2801,this->m_minFilter);
    (*gl->texParameteri)(0x8513,0x2800,this->m_magFilter);
  }
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)local_188,&referenceFrame,
             (PixelFormat *)(CONCAT44(extraout_var_03,iVar2) + 8),0,height_00,width_00,height);
  iVar2 = *(int *)&this->m_onlySampleFaceInterior;
  if ((char)iVar2 == '\0') {
    fStack_1b4 = -0.975;
    local_1c0.m_data[1] = 0.975;
  }
  else {
    fStack_1b4 = -0.81;
    local_1c0.m_data[1] = 0.8;
  }
  score = (int)fStack_1b4;
  local_1c0.m_data[0] = local_1c0.m_data[1];
  uVar5 = CONCAT44((iVar2 << 0x1f) >> 0x1f,(iVar2 << 0x1f) >> 0x1f);
  local_1b0.m_data = (float  [2])(uVar5 & DAT_009a4d00 | ~uVar5 & (ulong)DAT_009a4cf0);
  renderFaces(gl,(SurfaceAccess *)local_188,
              &(this->m_textures).
               super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
               super__Vector_impl_data._M_start[bVar4]->m_refTexture,(ReferenceParams *)local_104,
              renderer,viewport.x,viewport.y + height_00,width_00,height,(Vec2 *)&score,&local_1c0,
              &local_1b0);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)local_188,&referenceFrame,
             (PixelFormat *)(CONCAT44(extraout_var_04,iVar2) + 8),width_00,height_00,width,height);
  score = 0x3f000000;
  fStack_1b4 = -0.65;
  uVar5 = CONCAT44((*(int *)&this->m_onlySampleFaceInterior << 0x1f) >> 0x1f,
                   (*(int *)&this->m_onlySampleFaceInterior << 0x1f) >> 0x1f);
  local_1c0.m_data = (float  [2])(uVar5 & 0xbf4ccccd3f4ccccd | ~uVar5 & (ulong)DAT_009a4d40);
  local_1b0.m_data = (float  [2])(uVar5 & DAT_009a4d00 | ~uVar5 & (ulong)DAT_009a4d20);
  renderFaces(gl,(SurfaceAccess *)local_188,
              &(this->m_textures).
               super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
               super__Vector_impl_data._M_start[bVar4]->m_refTexture,(ReferenceParams *)local_104,
              renderer,viewport.x + width_00,viewport.y + height_00,width,height,(Vec2 *)&score,
              &local_1c0,&local_1b0);
  context = this->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_188,&renderedFrame);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_188);
  fVar3 = (float)glu::TextureTestUtil::measureAccuracy
                           (log,&referenceFrame,&renderedFrame,0x10,10000);
  score = (int)fVar3;
  this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
  de::toString<int>((string *)local_188,&score);
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,(char *)local_188._0_8_);
  std::__cxx11::string::~string((string *)local_188);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  return STOP;
}

Assistant:

TextureCubeFilteringCase::IterateResult TextureCubeFilteringCase::iterate (void)
{
	const glw::Functions&		gl					= m_renderCtx.getFunctions();
	TestLog&					log					= m_testCtx.getLog();
	const int					cellSize			= 28;
	const int					defViewportWidth	= cellSize*6;
	const int					defViewportHeight	= cellSize*4;
	RandomViewport				viewport			(m_renderCtx.getRenderTarget(), cellSize*6, cellSize*4, deStringHash(getName()));
	tcu::Surface				renderedFrame		(viewport.width, viewport.height);
	tcu::Surface				referenceFrame		(viewport.width, viewport.height);
	ReferenceParams				sampleParams		(TEXTURETYPE_CUBE);
	const tcu::TextureFormat&	texFmt				= m_textures[0]->getRefTexture().getFormat();
	tcu::TextureFormatInfo		fmtInfo				= tcu::getTextureFormatInfo(texFmt);

	// Accuracy measurements are off unless viewport size is exactly as expected.
	if (getNodeType() == tcu::NODETYPE_ACCURACY && (viewport.width < defViewportWidth || viewport.height < defViewportHeight))
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Viewport is divided into 4 sections.
	int				leftWidth			= viewport.width / 2;
	int				rightWidth			= viewport.width - leftWidth;
	int				bottomHeight		= viewport.height / 2;
	int				topHeight			= viewport.height - bottomHeight;

	int				curTexNdx			= 0;

	// Sampling parameters.
	sampleParams.sampler					= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.samplerType				= getSamplerType(texFmt);
	sampleParams.colorBias					= fmtInfo.lookupBias;
	sampleParams.colorScale					= fmtInfo.lookupScale;
	sampleParams.lodMode					= LODMODE_EXACT;

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Setup gradient texture.
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textures[curTexNdx]->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);

	// Bottom left: Minification
	renderFaces(gl,
				tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, leftWidth, bottomHeight),
				m_textures[curTexNdx]->getRefTexture(), sampleParams,
				m_renderer,
				viewport.x, viewport.y, leftWidth, bottomHeight,
				m_onlySampleFaceInterior ? tcu::Vec2(-0.81f, -0.81f) : tcu::Vec2(-0.975f, -0.975f),
				m_onlySampleFaceInterior ? tcu::Vec2( 0.8f,  0.8f) : tcu::Vec2( 0.975f,  0.975f),
				!m_onlySampleFaceInterior ? tcu::Vec2(1.3f, 1.25f) : tcu::Vec2(1.0f, 1.0f));

	// Bottom right: Magnification
	renderFaces(gl,
				tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, 0, rightWidth, bottomHeight),
				m_textures[curTexNdx]->getRefTexture(), sampleParams,
				m_renderer,
				viewport.x+leftWidth, viewport.y, rightWidth, bottomHeight,
				tcu::Vec2(0.5f, 0.65f), m_onlySampleFaceInterior ? tcu::Vec2(0.8f, 0.8f) : tcu::Vec2(0.975f, 0.975f),
				!m_onlySampleFaceInterior ? tcu::Vec2(1.1f, 1.06f) : tcu::Vec2(1.0f, 1.0f));

	if (m_textures.size() >= 2)
	{
		curTexNdx += 1;

		// Setup second texture.
		gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textures[curTexNdx]->getGLTexture());
		gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	}

	// Top left: Minification
	renderFaces(gl,
				tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, bottomHeight, leftWidth, topHeight),
				m_textures[curTexNdx]->getRefTexture(), sampleParams,
				m_renderer,
				viewport.x, viewport.y+bottomHeight, leftWidth, topHeight,
				m_onlySampleFaceInterior ? tcu::Vec2(-0.81f, -0.81f) : tcu::Vec2(-0.975f, -0.975f),
				m_onlySampleFaceInterior ? tcu::Vec2( 0.8f,  0.8f) : tcu::Vec2( 0.975f,  0.975f),
				!m_onlySampleFaceInterior ? tcu::Vec2(1.3f, 1.25f) : tcu::Vec2(1.0f, 1.0f));

	// Top right: Magnification
	renderFaces(gl,
				tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, bottomHeight, rightWidth, topHeight),
				m_textures[curTexNdx]->getRefTexture(), sampleParams,
				m_renderer,
				viewport.x+leftWidth, viewport.y+bottomHeight, rightWidth, topHeight,
				tcu::Vec2(0.5f, -0.65f), m_onlySampleFaceInterior ? tcu::Vec2(0.8f, -0.8f) : tcu::Vec2(0.975f, -0.975f),
				!m_onlySampleFaceInterior ? tcu::Vec2(1.1f, 1.06f) : tcu::Vec2(1.0f, 1.0f));

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const int	bestScoreDiff	= 16;
		const int	worstScoreDiff	= 10000;

		int score = measureAccuracy(log, referenceFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}